

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

exr_result_t exr_get_file_name(exr_const_context_t ctxt,char **name)

{
  undefined8 *in_RSI;
  exr_const_context_t in_RDI;
  exr_result_t local_4;
  
  if (in_RDI == (exr_const_context_t)0x0) {
    local_4 = 2;
  }
  else if (in_RSI == (undefined8 *)0x0) {
    local_4 = (*in_RDI->standard_error)(in_RDI,3);
  }
  else {
    *in_RSI = (in_RDI->filename).str;
    if (in_RDI->mode == '\x01') {
      internal_exr_unlock(in_RDI);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

exr_result_t
exr_get_file_name (exr_const_context_t ctxt, const char** name)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    /* not changeable after construction, no locking needed */
    if (name)
    {
        *name = ctxt->filename.str;
        if (ctxt->mode == EXR_CONTEXT_WRITE) internal_exr_unlock (ctxt);
        return EXR_ERR_SUCCESS;
    }

    return ctxt->standard_error (ctxt, EXR_ERR_INVALID_ARGUMENT);
}